

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

void Kit_DsdCompSort(int *pPrios,uint *uSupps,unsigned_short *piLits,int nVars,uint *piLitsRes)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int Priority [16];
  int pOrder [16];
  int nSuppSizes [16];
  int local_f8 [16];
  int local_b8 [16];
  int aiStack_78 [18];
  
  uVar8 = (ulong)(uint)nVars;
  if (0 < nVars) {
    uVar2 = 0;
    do {
      uVar6 = uSupps[uVar2];
      if (uVar6 == 0) {
        __assert_fail("uSupps[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                      ,0x5d8,
                      "void Kit_DsdCompSort(int *, unsigned int *, unsigned short *, int, unsigned int *)"
                     );
      }
      local_b8[uVar2] = (int)uVar2;
      local_f8[uVar2] = 100000000;
      lVar7 = 0;
      do {
        if ((uVar6 >> ((uint)lVar7 & 0x1f) & 1) != 0) {
          iVar3 = pPrios[lVar7];
          if (local_f8[uVar2] < pPrios[lVar7]) {
            iVar3 = local_f8[uVar2];
          }
          local_f8[uVar2] = iVar3;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x10);
      if (local_f8[uVar2] == 0x10) {
        __assert_fail("Priority[i] != 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                      ,0x5de,
                      "void Kit_DsdCompSort(int *, unsigned int *, unsigned short *, int, unsigned int *)"
                     );
      }
      uVar6 = (uVar6 >> 1 & 0x55555555) + (uVar6 & 0x55555555);
      uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
      uVar6 = (uVar6 >> 4 & 0x7070707) + (uVar6 & 0x7070707);
      uVar6 = (uVar6 >> 8 & 0xf000f) + (uVar6 & 0xf000f);
      aiStack_78[uVar2] = (uVar6 >> 0x10) + (uVar6 & 0xffff);
      uVar2 = uVar2 + 1;
    } while (uVar2 != uVar8);
  }
  iVar3 = 0;
  Extra_BubbleSort(local_b8,local_f8,nVars,0);
  uVar2 = 0xffffffff;
  iVar1 = -1;
  if (0 < nVars) {
    uVar4 = 0;
    iVar5 = 0;
    do {
      iVar1 = aiStack_78[uVar4];
      if ((iVar5 < iVar1) || ((iVar5 == iVar1 && (iVar3 < local_f8[uVar4])))) {
        iVar3 = local_f8[uVar4];
        uVar2 = uVar4 & 0xffffffff;
        iVar5 = iVar1;
      }
      iVar1 = (int)uVar2;
      uVar4 = uVar4 + 1;
    } while (uVar8 != uVar4);
  }
  if (iVar1 != -1) {
    *piLitsRes = (uint)piLits[iVar1];
    iVar3 = 1;
    if (0 < nVars) {
      uVar2 = 0;
      do {
        if (local_b8[uVar2] != iVar1) {
          lVar7 = (long)iVar3;
          iVar3 = iVar3 + 1;
          piLitsRes[lVar7] = (uint)piLits[local_b8[uVar2]];
        }
        uVar2 = uVar2 + 1;
      } while (uVar8 != uVar2);
    }
    if (iVar3 == nVars) {
      return;
    }
    __assert_fail("k == nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                  ,0x5fa,
                  "void Kit_DsdCompSort(int *, unsigned int *, unsigned short *, int, unsigned int *)"
                 );
  }
  __assert_fail("iVarBest != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                ,0x5f0,
                "void Kit_DsdCompSort(int *, unsigned int *, unsigned short *, int, unsigned int *)"
               );
}

Assistant:

void Kit_DsdCompSort( int pPrios[], unsigned uSupps[], unsigned short * piLits, int nVars, unsigned piLitsRes[] )
{
    int nSuppSizes[16], Priority[16], pOrder[16];
    int i, k, iVarBest, SuppMax, PrioMax;
    // compute support sizes and priorities of the components
    for ( i = 0; i < nVars; i++ )
    {
        assert( uSupps[i] );
        pOrder[i] = i;
        Priority[i] = KIT_INFINITY;
        for ( k = 0; k < 16; k++ )
            if ( uSupps[i] & (1 << k) )
                Priority[i] = KIT_MIN( Priority[i], pPrios[k] );
        assert( Priority[i] != 16 );
        nSuppSizes[i] = Kit_WordCountOnes(uSupps[i]);
    }
    // sort the components by pririty
    Extra_BubbleSort( pOrder, Priority, nVars, 0 );
    // find the component by with largest size and lowest priority
    iVarBest = -1;
    SuppMax  = 0;
    PrioMax  = 0;
    for ( i = 0; i < nVars; i++ )
    {
        if ( SuppMax < nSuppSizes[i] || (SuppMax == nSuppSizes[i] && PrioMax < Priority[i]) )
        {
            SuppMax  = nSuppSizes[i];
            PrioMax  = Priority[i];
            iVarBest = i;
        }
    }
    assert( iVarBest != -1 );
    // copy the resulting literals
    k = 0;
    piLitsRes[k++] = piLits[iVarBest];
    for ( i = 0; i < nVars; i++ )
    {
        if ( pOrder[i] == iVarBest )
            continue;
        piLitsRes[k++] = piLits[pOrder[i]];
    }
    assert( k == nVars );
}